

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestOutput_printTestsEnded_TestShell::createTest
          (TEST_TestOutput_printTestsEnded_TestShell *this)

{
  TEST_TestOutput_printTestsEnded_Test *this_00;
  TEST_TestOutput_printTestsEnded_TestShell *this_local;
  
  this_00 = (TEST_TestOutput_printTestsEnded_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                         ,0xfd);
  TEST_TestOutput_printTestsEnded_Test::TEST_TestOutput_printTestsEnded_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestOutput, printTestsEnded)
{
    result->countTest();
    result->countCheck();
    result->countIgnored();
    result->countIgnored();
    result->countRun();
    result->countRun();
    result->countRun();
    printer->printTestsEnded(*result);
    STRCMP_EQUAL("\nOK (1 tests, 3 ran, 1 checks, 2 ignored, 0 filtered out, 10 ms)\n\n", mock->getOutput().asCharString());
}